

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::StringEnumeration::setChars
          (StringEnumeration *this,char *s,int32_t length,UErrorCode *status)

{
  size_t sVar1;
  char16_t *us;
  UnicodeString *this_00;
  
  if ((s != (char *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (length < 0) {
      sVar1 = strlen(s);
      length = (int32_t)sVar1;
    }
    this_00 = &this->unistr;
    us = UnicodeString::getBuffer(this_00,length + 1);
    if (us != (char16_t *)0x0) {
      u_charsToUChars_63(s,us,length);
      us[length] = L'\0';
      UnicodeString::releaseBuffer(this_00,length);
      return this_00;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UnicodeString *)0x0;
}

Assistant:

UnicodeString *
StringEnumeration::setChars(const char *s, int32_t length, UErrorCode &status) {
    if(U_SUCCESS(status) && s!=NULL) {
        if(length<0) {
            length=(int32_t)uprv_strlen(s);
        }

        UChar *buffer=unistr.getBuffer(length+1);
        if(buffer!=NULL) {
            u_charsToUChars(s, buffer, length);
            buffer[length]=0;
            unistr.releaseBuffer(length);
            return &unistr;
        } else {
            status=U_MEMORY_ALLOCATION_ERROR;
        }
    }

    return NULL;
}